

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O1

bool URL::HasInsecureProtocol(char *in,int inlen)

{
  bool bVar1;
  int iVar2;
  
  if ((uint)inlen < 8) {
LAB_0012a96d:
    if (8 < (uint)inlen) {
      iVar2 = strncasecmp(in,"https://",8);
      if (iVar2 == 0) goto LAB_0012a9ab;
    }
    if (6 < (uint)inlen) {
      iVar2 = strncasecmp(in,"ftp://",6);
      if (iVar2 == 0) goto LAB_0012a9ab;
    }
    bVar1 = true;
  }
  else {
    iVar2 = strncasecmp(in,"http://",7);
    if (iVar2 != 0) goto LAB_0012a96d;
LAB_0012a9ab:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool HasInsecureProtocol(const char* in, int inlen) {
  if (inlen > strliterallen("http://") &&
      strncasecmp(in, "http://", strliterallen("http://")) == 0) {
    return false;  // We're ok, it's an http protocol
  }
  if (inlen > strliterallen("https://") &&
      strncasecmp(in, "https://", strliterallen("https://")) == 0) {
    return false;  // https is ok as well
  }
  if (inlen > strliterallen("ftp://") &&
      strncasecmp(in, "ftp://", strliterallen("ftp://")) == 0) {
    return false;  // and ftp
  }
  return true;
}